

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplace_back<(anonymous_namespace)::Constructable&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,Constructable *args)

{
  ulong uVar1;
  pointer pCVar2;
  reference pCVar3;
  reference extraout_RAX;
  uint uVar4;
  pointer ctx;
  int iVar5;
  int *piVar6;
  pointer pCVar7;
  pointer pCVar8;
  ulong uVar9;
  pointer pCVar10;
  
  uVar1 = this->len;
  pCVar10 = this->data_ + uVar1;
  if (uVar1 == this->cap) {
    if (uVar1 == 0xfffffffffffffff) {
      detail::throwLengthError();
    }
    uVar9 = uVar1 + 1;
    if (uVar1 + 1 < uVar1 * 2) {
      uVar9 = uVar1 * 2;
    }
    if (0xfffffffffffffff - uVar1 < uVar1) {
      uVar9 = 0xfffffffffffffff;
    }
    pCVar2 = (pointer)operator_new(uVar9 * 8);
    iVar5 = args->value;
    pCVar2[uVar1].constructed = true;
    pCVar2[uVar1].value = iVar5;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    ctx = this->data_;
    pCVar7 = ctx + this->len;
    if (pCVar7 == pCVar10) {
      if (this->len != 0) {
        iVar5 = 0;
        pCVar7 = pCVar2;
        do {
          pCVar7->constructed = true;
          pCVar7->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar7 = pCVar7 + 1;
          iVar5 = iVar5 + -1;
        } while (ctx != pCVar10);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar5;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar5;
      }
    }
    else {
      if (ctx != pCVar10) {
        iVar5 = 0;
        pCVar8 = pCVar2;
        do {
          pCVar8->constructed = true;
          pCVar8->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar8 = pCVar8 + 1;
          iVar5 = iVar5 + -1;
        } while (ctx != pCVar10);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar5;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar5;
      }
      piVar6 = &pCVar2[uVar1 + 1].value;
      ctx = (pointer)0x0;
      do {
        ((Constructable *)(piVar6 + -1))->constructed = true;
        *piVar6 = pCVar10->value;
        pCVar10->value = 0;
        pCVar10 = pCVar10 + 1;
        piVar6 = piVar6 + 2;
        uVar4 = (int)ctx - 1;
        ctx = (pointer)(ulong)uVar4;
      } while (pCVar10 != pCVar7);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar4;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar4;
    }
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar9;
    this->data_ = pCVar2;
    pCVar3 = extraout_RAX;
  }
  else {
    uVar4 = args->value;
    pCVar3 = (reference)(ulong)uVar4;
    pCVar10->constructed = true;
    pCVar10->value = uVar4;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    this->len = uVar1 + 1;
  }
  return pCVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }